

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::Graph(Graph *this,uint64_t n,uint64_t m)

{
  allocator<unsigned_long> *paVar1;
  uint64_t uVar2;
  bool bVar3;
  ulong uVar4;
  double dVar5;
  undefined1 auVar6 [16];
  _Node_iterator_base<Graph::LightEdge,_true> local_138;
  LightEdge local_130;
  _Node_iterator_base<Graph::LightEdge,_true> local_120;
  iterator it;
  uint64_t i;
  uniform_int_distribution<unsigned_long> vertex;
  anon_class_40_5_88fd879f addEdge;
  unordered_set<Graph::LightEdge,_std::hash<Graph::LightEdge>,_std::equal_to<Graph::LightEdge>,_std::allocator<Graph::LightEdge>_>
  helper;
  uint64_t index;
  uint64_t v;
  uint64_t u;
  uniform_int_distribution<unsigned_long> randomVertex;
  pointer local_70;
  allocator<Graph::Colors> local_61;
  value_type local_60;
  allocator<Graph::Edge> local_59;
  Edge local_58;
  allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> local_21;
  uint64_t local_20;
  uint64_t m_local;
  uint64_t n_local;
  Graph *this_local;
  
  local_20 = m;
  m_local = n;
  n_local = (uint64_t)this;
  std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::allocator(&local_21);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&this->matrix,n,&local_21);
  std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~allocator(&local_21)
  ;
  uVar2 = local_20;
  Edge::Edge(&local_58,0,0,false,0);
  std::allocator<Graph::Edge>::allocator(&local_59);
  std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::vector
            (&this->edges,uVar2,&local_58,&local_59);
  std::allocator<Graph::Edge>::~allocator(&local_59);
  uVar2 = m_local;
  local_60 = White;
  std::allocator<Graph::Colors>::allocator(&local_61);
  std::vector<Graph::Colors,_std::allocator<Graph::Colors>_>::vector
            (&this->colorMap,uVar2,&local_60,&local_61);
  std::allocator<Graph::Colors>::~allocator(&local_61);
  uVar2 = m_local;
  local_70 = (pointer)0x0;
  paVar1 = (allocator<unsigned_long> *)((long)&randomVertex._M_param._M_b + 7);
  std::allocator<unsigned_long>::allocator(paVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->sums,uVar2,(value_type_conflict *)&local_70,paVar1);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)((long)&randomVertex._M_param._M_b + 7));
  uVar2 = m_local;
  paVar1 = (allocator<unsigned_long> *)((long)&randomVertex._M_param._M_b + 6);
  std::allocator<unsigned_long>::allocator(paVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->time_discover,uVar2,paVar1);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)((long)&randomVertex._M_param._M_b + 6));
  uVar2 = m_local;
  paVar1 = (allocator<unsigned_long> *)((long)&randomVertex._M_param._M_b + 5);
  std::allocator<unsigned_long>::allocator(paVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->time_minimal,uVar2,paVar1);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)((long)&randomVertex._M_param._M_b + 5));
  std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>::vector(&this->bridges);
  std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_long> *)&u,0,m_local - 1);
  helper._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_set<Graph::LightEdge,_std::hash<Graph::LightEdge>,_std::equal_to<Graph::LightEdge>,_std::allocator<Graph::LightEdge>_>
  ::unordered_set((unordered_set<Graph::LightEdge,_std::hash<Graph::LightEdge>,_std::equal_to<Graph::LightEdge>,_std::allocator<Graph::LightEdge>_>
                   *)&addEdge.index);
  auVar6._8_4_ = (int)(local_20 >> 0x20);
  auVar6._0_8_ = local_20;
  auVar6._12_4_ = 0x45300000;
  dVar5 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)local_20) - 4503599627370496.0)) * 2.2;
  uVar4 = (ulong)dVar5;
  std::
  unordered_set<Graph::LightEdge,_std::hash<Graph::LightEdge>,_std::equal_to<Graph::LightEdge>,_std::allocator<Graph::LightEdge>_>
  ::reserve((unordered_set<Graph::LightEdge,_std::hash<Graph::LightEdge>,_std::equal_to<Graph::LightEdge>,_std::allocator<Graph::LightEdge>_>
             *)&addEdge.index,uVar4 | (long)(dVar5 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f);
  vertex._M_param._M_b = (unsigned_long)&addEdge.index;
  addEdge.helper =
       (unordered_set<Graph::LightEdge,_std::hash<Graph::LightEdge>,_std::equal_to<Graph::LightEdge>,_std::allocator<Graph::LightEdge>_>
        *)&v;
  addEdge.u = &index;
  addEdge.this = (Graph *)&helper._M_h._M_single_bucket;
  addEdge.v = (uint64_t *)this;
  for (index = 1; index <= m_local - 1; index = index + 1) {
    std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
              ((uniform_int_distribution<unsigned_long> *)&i,0,index - 1);
    v = std::uniform_int_distribution<unsigned_long>::operator()
                  ((uniform_int_distribution<unsigned_long> *)&i,&engine);
    Graph::anon_class_40_5_88fd879f::operator()((anon_class_40_5_88fd879f *)&vertex._M_param._M_b);
  }
  for (it.super__Node_iterator_base<Graph::LightEdge,_true>._M_cur =
            (_Node_iterator_base<Graph::LightEdge,_true>)(__node_type *)0x0;
      (ulong)it.super__Node_iterator_base<Graph::LightEdge,_true>._M_cur <
      (__node_type *)(local_20 + (1 - m_local));
      it.super__Node_iterator_base<Graph::LightEdge,_true>._M_cur =
           (_Node_iterator_base<Graph::LightEdge,_true>)
           ((long)it.super__Node_iterator_base<Graph::LightEdge,_true>._M_cur + 1)) {
    do {
      v = std::uniform_int_distribution<unsigned_long>::operator()
                    ((uniform_int_distribution<unsigned_long> *)&u,&engine);
      index = std::uniform_int_distribution<unsigned_long>::operator()
                        ((uniform_int_distribution<unsigned_long> *)&u,&engine);
      LightEdge::LightEdge(&local_130,v,index);
      local_120._M_cur =
           (__node_type *)
           std::
           unordered_set<Graph::LightEdge,_std::hash<Graph::LightEdge>,_std::equal_to<Graph::LightEdge>,_std::allocator<Graph::LightEdge>_>
           ::find((unordered_set<Graph::LightEdge,_std::hash<Graph::LightEdge>,_std::equal_to<Graph::LightEdge>,_std::allocator<Graph::LightEdge>_>
                   *)&addEdge.index,&local_130);
      local_138._M_cur =
           (__node_type *)
           std::
           unordered_set<Graph::LightEdge,_std::hash<Graph::LightEdge>,_std::equal_to<Graph::LightEdge>,_std::allocator<Graph::LightEdge>_>
           ::end((unordered_set<Graph::LightEdge,_std::hash<Graph::LightEdge>,_std::equal_to<Graph::LightEdge>,_std::allocator<Graph::LightEdge>_>
                  *)&addEdge.index);
      bVar3 = std::__detail::operator!=(&local_120,&local_138);
      if (bVar3) {
        v = index;
      }
    } while (v == index);
    Graph::anon_class_40_5_88fd879f::operator()((anon_class_40_5_88fd879f *)&vertex._M_param._M_b);
  }
  std::
  unordered_set<Graph::LightEdge,_std::hash<Graph::LightEdge>,_std::equal_to<Graph::LightEdge>,_std::allocator<Graph::LightEdge>_>
  ::~unordered_set((unordered_set<Graph::LightEdge,_std::hash<Graph::LightEdge>,_std::equal_to<Graph::LightEdge>,_std::allocator<Graph::LightEdge>_>
                    *)&addEdge.index);
  return;
}

Assistant:

Graph::Graph(std::uint64_t n, std::uint64_t m)
    : matrix(n), edges(m, Edge(0, 0, false, 0)), colorMap(n, Colors::White),
      sums(n, 0), time_discover(n), time_minimal(n) {
    std::uniform_int_distribution<std::uint64_t> randomVertex(0, n - 1);
    std::uint64_t u, v, index = 0;

    std::unordered_set<LightEdge> helper;
    helper.reserve(2.2 * m);

    auto addEdge = [&]() {
        helper.emplace(u, v);
        helper.emplace(v, u);
        matrix[u].push_back(index);
        matrix[v].push_back(index);
        edges[index].v = v;
        edges[index++].u = u;
    };

    for (v = 1; v <= n - 1; ++v) {
        std::uniform_int_distribution<std::uint64_t> vertex(0, v - 1);
        u = vertex(engine);
        addEdge();
    }

    for (std::uint64_t i = 0; i < m - n + 1; ++i) {
        do {
            u = randomVertex(engine);
            v = randomVertex(engine);
            auto it = helper.find(LightEdge{u, v});
            if (it != helper.end())
                u = v;
        } while (u == v);

        addEdge();
    }
}